

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

void Vec_IntPushFirst(Vec_Int_t *p,int Entry)

{
  int iVar1;
  int local_18;
  int i;
  int Entry_local;
  Vec_Int_t *p_local;
  
  if (p->nSize == p->nCap) {
    if (p->nCap < 0x10) {
      Vec_IntGrow(p,0x10);
    }
    else {
      Vec_IntGrow(p,p->nCap << 1);
    }
  }
  p->nSize = p->nSize + 1;
  iVar1 = p->nSize;
  while (local_18 = iVar1 + -1, 0 < local_18) {
    p->pArray[local_18] = p->pArray[iVar1 + -2];
    iVar1 = local_18;
  }
  *p->pArray = Entry;
  return;
}

Assistant:

static inline void Vec_IntPushFirst( Vec_Int_t * p, int Entry )
{
    int i;
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_IntGrow( p, 16 );
        else
            Vec_IntGrow( p, 2 * p->nCap );
    }
    p->nSize++;
    for ( i = p->nSize - 1; i >= 1; i-- )
        p->pArray[i] = p->pArray[i-1];
    p->pArray[0] = Entry;
}